

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::AggressiveDCEPass::GetHeaderBlock(AggressiveDCEPass *this,BasicBlock *blk)

{
  bool bVar1;
  uint32_t uVar2;
  StructuredCFGAnalysis *this_00;
  BasicBlock *pBVar3;
  
  if (blk == (BasicBlock *)0x0) {
    blk = (BasicBlock *)0x0;
  }
  else {
    bVar1 = BasicBlock::IsLoopHeader(blk);
    if (!bVar1) {
      this_00 = IRContext::GetStructuredCFGAnalysis((this->super_MemPass).super_Pass.context_);
      uVar2 = BasicBlock::id(blk);
      uVar2 = StructuredCFGAnalysis::ContainingConstruct(this_00,uVar2);
      pBVar3 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,uVar2);
      return pBVar3;
    }
  }
  return blk;
}

Assistant:

BasicBlock* AggressiveDCEPass::GetHeaderBlock(BasicBlock* blk) const {
  if (blk == nullptr) {
    return nullptr;
  }

  BasicBlock* header_block = nullptr;
  if (blk->IsLoopHeader()) {
    header_block = blk;
  } else {
    uint32_t header =
        context()->GetStructuredCFGAnalysis()->ContainingConstruct(blk->id());
    header_block = context()->get_instr_block(header);
  }
  return header_block;
}